

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3.cpp
# Opt level: O3

string * StringFormatVa_abi_cxx11_(string *__return_storage_ptr__,PCSTR format,__va_list_tag *va)

{
  pointer pcVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  vector<char,_std::allocator<char>_> s;
  va_list va2;
  allocator_type local_51;
  vector<char,_std::allocator<char>_> local_50;
  undefined8 local_38;
  void *pvStack_30;
  void *local_28;
  
  local_28 = va->reg_save_area;
  local_38._0_4_ = va->gp_offset;
  local_38._4_4_ = va->fp_offset;
  pvStack_30 = va->overflow_arg_area;
  iVar2 = vsnprintf((char *)0x0,0,format,va);
  std::vector<char,_std::allocator<char>_>::vector(&local_50,(long)(iVar2 + 2),&local_51);
  vsnprintf(local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_start,
            (long)local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start,format,&local_38);
  pcVar1 = local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start == (char *)0x0) {
    pcVar4 = (char *)0x1;
  }
  else {
    sVar3 = strlen(local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start);
    pcVar4 = pcVar1 + sVar3;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar1,pcVar4);
  if (local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringFormatVa (PCSTR format, va_list va)
{
    // Some systems, including Linux/amd64, cannot consume a
    // va_list multiple times. It must be copied first.
    // Passing the parameter twice does not work.
#ifndef _WIN32
    va_list va2;
#ifdef __va_copy
    __va_copy (va2, va);
#else
    va_copy (va2, va); // C99
#endif
#endif

    std::vector <char> s (string_vformat_length (format, va));

#ifdef _WIN32
    _vsnprintf (&s [0], s.size (), format, va);
#else
    vsnprintf (&s [0], s.size (), format, va2);
#endif
    return &s [0];
}